

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

void __thiscall
cmPauseContext::cmPauseContext(cmPauseContext *this,master_mutex_t *m,cmDebugger *debugger)

{
  int iVar1;
  duration<long,_std::ratio<1L,_1000L>_> local_18;
  
  this->Debugger = debugger;
  (this->Lock)._M_device = m;
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)m);
  (this->Lock)._M_owns = iVar1 == 0;
  if (iVar1 != 0) {
    iVar1 = (*this->Debugger->_vptr_cmDebugger[9])();
    if (iVar1 == 2) {
      local_18.__r = 100;
      std::unique_lock<std::recursive_timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                (&this->Lock,&local_18);
    }
  }
  return;
}

Assistant:

cmPauseContext::cmPauseContext(master_mutex_t& m, cmDebugger* debugger)
  : Debugger(debugger)
  , Lock(m, std::try_to_lock)
{
  // If we didn't aquire the lock, but the current state is paused, we are
  // likely
  // in a very simple race condition; right before the main thread is about to
  // wait.
  // This is fine in general but annoying for unit testing. A smallish timeout
  // is used here for consistency. The only conditions that will fail are:
  // a) Incredibly slow machine; or starved threads
  // b) Multiple cmPauseContexts in multiple threads were created
  // c) Execution was resumed as this oject was created
  if (!Lock.owns_lock() &&
      Debugger->CurrentState() == cmDebugger::State::Paused) {
    Lock.try_lock_for(std::chrono::milliseconds(100));
  }
}